

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O1

ssize_t xz_filter_read(archive_read_filter *self,void **p)

{
  size_t min;
  lzma_stream *strm;
  lzma_stream *strm_00;
  bool bVar1;
  lzma_ret lVar2;
  uint32_t uVar3;
  int iVar4;
  void *pvVar5;
  uint8_t *puVar6;
  int *piVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  char *fmt;
  archive_read *a;
  ssize_t sVar11;
  size_t size;
  ssize_t avail_in;
  uchar props [5];
  lzma_filter filters [2];
  ssize_t avail_in_1;
  size_t local_70;
  uint8_t local_65;
  int local_64;
  void **local_60;
  lzma_filter local_58;
  undefined8 local_48;
  undefined8 local_40;
  ssize_t local_38;
  
  strm = (lzma_stream *)self->data;
  sVar9 = strm[1].avail_in;
  strm->next_out = strm[1].next_in;
  strm->avail_out = sVar9;
  if (sVar9 != 0) {
    do {
      if (*(char *)&strm[1].next_out != '\0') break;
      if (*(char *)((long)&strm[1].next_out + 1) == '\0') {
        strm_00 = (lzma_stream *)self->data;
        pvVar5 = __archive_read_filter_ahead(self->upstream,6,&local_38);
        sVar11 = -0x1e;
        if (pvVar5 == (void *)0x0) {
LAB_00141643:
          bVar1 = false;
        }
        else {
          *(undefined1 *)((long)&strm_00[1].next_out + 2) = *(undefined1 *)((long)pvVar5 + 4);
          local_65 = ']';
          uVar8 = *(byte *)((long)pvVar5 + 5) & 0x1f;
          if (uVar8 - 0x1e < 0xffffffee) goto LAB_00141643;
          uVar10 = 1 << (sbyte)uVar8;
          local_64 = (uint)(*(byte *)((long)pvVar5 + 5) >> 5) * (uVar10 >> 4);
          if (uVar8 < 0xd) {
            local_64 = 0;
          }
          local_64 = uVar10 - local_64;
          local_60 = p;
          __archive_read_filter_consume(self->upstream,6);
          strm_00[1].avail_out = 6;
          local_58.id = 0x4000000000000001;
          local_58.options = (void *)0x0;
          local_48 = 0xffffffffffffffff;
          local_40 = 0;
          lVar2 = lzma_properties_decode(&local_58,(lzma_allocator *)0x0,&local_65,5);
          if (lVar2 == LZMA_OK) {
            lVar2 = lzma_raw_decoder(strm_00,&local_58);
            free(local_58.options);
            if (lVar2 != LZMA_OK) goto LAB_001416ed;
            bVar1 = true;
            sVar11 = 0;
            p = local_60;
          }
          else {
LAB_001416ed:
            set_error(self,lVar2);
            bVar1 = false;
            p = local_60;
          }
        }
        if (!bVar1) {
          return sVar11;
        }
        *(undefined1 *)((long)&strm[1].next_out + 1) = 1;
      }
      puVar6 = (uint8_t *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_70);
      strm->next_in = puVar6;
      if ((long)local_70 < 0 && puVar6 == (uint8_t *)0x0) {
        archive_set_error(&self->archive->archive,-1,"truncated input");
        return -0x1e;
      }
      strm->avail_in = local_70;
      lVar2 = lzma_code(strm,(uint)(local_70 == 0) * 3);
      if (lVar2 != LZMA_OK) {
        if (lVar2 != LZMA_STREAM_END) {
          set_error(self,lVar2);
          return -0x1e;
        }
        *(undefined1 *)&strm[1].next_out = 1;
      }
      __archive_read_filter_consume(self->upstream,local_70 - strm->avail_in);
      strm[1].avail_out = strm[1].avail_out + (local_70 - strm->avail_in);
    } while (strm->avail_out != 0);
  }
  size = (long)strm->next_out - (long)strm[1].next_in;
  strm[1].total_in = strm[1].total_in + size;
  strm[1].total_out = strm[1].total_out + size;
  sVar9 = size;
  if (size == 0) {
    *p = (void *)0x0;
  }
  else {
    *p = strm[1].next_in;
    if (self->code == 9) {
      uVar3 = lzma_crc32(strm[1].next_in,size,*(uint32_t *)((long)&strm[1].next_out + 4));
      *(uint32_t *)((long)&strm[1].next_out + 4) = uVar3;
      if (*(char *)&strm[1].next_out != '\0') {
        pvVar5 = self->data;
        min = (ulong)(*(char *)((long)pvVar5 + 0xa2) != '\0') * 8 + 0xc;
        piVar7 = (int *)__archive_read_filter_ahead(self->upstream,min,(ssize_t *)&local_58);
        sVar9 = 0xffffffffffffffe2;
        if (piVar7 != (int *)0x0 || -1 < (long)local_58.id) {
          if ((long)local_58.id < (long)min || piVar7 == (int *)0x0) {
            a = self->archive;
            fmt = "Lzip: Remaining data is less bytes";
          }
          else if (*(int *)((long)pvVar5 + 0xa4) == *piVar7) {
            if (*(long *)((long)pvVar5 + 0xb0) == *(long *)(piVar7 + 1)) {
              if ((*(char *)((long)pvVar5 + 0xa2) != '\x01') ||
                 (*(long *)((long)pvVar5 + 0xa8) + min == *(long *)(piVar7 + 3))) {
                __archive_read_filter_consume(self->upstream,min);
                iVar4 = lzip_has_member(self->upstream);
                if (iVar4 != 0) {
                  *(undefined2 *)((long)pvVar5 + 0xa0) = 0;
                  *(undefined8 *)((long)pvVar5 + 0xa4) = 0;
                  *(undefined8 *)((long)pvVar5 + 0xac) = 0;
                  *(undefined4 *)((long)pvVar5 + 0xb4) = 0;
                  return size;
                }
                return size;
              }
              a = self->archive;
              fmt = "Lzip: Member size error";
            }
            else {
              a = self->archive;
              fmt = "Lzip: Uncompressed size error";
            }
          }
          else {
            a = self->archive;
            fmt = "Lzip: CRC32 error";
          }
          archive_set_error(&a->archive,-1,fmt);
          sVar9 = 0xffffffffffffffe7;
        }
      }
    }
  }
  return sVar9;
}

Assistant:

static ssize_t
xz_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		if (!state->in_stream) {
			/*
			 * Initialize liblzma for lzip
			 */
			ret = lzip_init(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			state->in_stream = 1;
		}
		state->stream.next_in =
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL && avail_in < 0) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = avail_in;

		/* Decompress as much as we can in one pass. */
		ret = lzma_code(&(state->stream),
		    (state->stream.avail_in == 0)? LZMA_FINISH: LZMA_RUN);
		switch (ret) {
		case LZMA_STREAM_END: /* Found end of stream. */
			state->eof = 1;
			/* FALL THROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			state->member_in +=
			    avail_in - state->stream.avail_in;
			break;
		default:
			set_error(self, ret);
			return (ARCHIVE_FATAL);
		}
	}

	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	state->member_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else {
		*p = state->out_block;
		if (self->code == ARCHIVE_FILTER_LZIP) {
			state->crc32 = lzma_crc32(state->out_block,
			    decompressed, state->crc32);
			if (state->eof) {
				ret = lzip_tail(self);
				if (ret != ARCHIVE_OK)
					return (ret);
			}
		}
	}
	return (decompressed);
}